

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-util.cc
# Opt level: O3

void __thiscall
wabt::interp::WriteCall
          (interp *this,Stream *stream,string_view name,FuncType *func_type,Values *params,
          Values *results,Ptr *trap)

{
  Stream::Writef((Stream *)this,"%.*s(",name.data_,stream);
  WriteValues((Stream *)this,(ValueTypes *)(name.size_ + 0x10),(Values *)func_type);
  Stream::Writef((Stream *)this,") =>");
  if ((results->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    WriteTrap((Stream *)this," error",(Ptr *)results);
    return;
  }
  if ((params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_start !=
      (params->super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    Stream::Writef((Stream *)this," ");
    WriteValues((Stream *)this,(ValueTypes *)(name.size_ + 0x28),params);
  }
  Stream::Writef((Stream *)this,"\n");
  return;
}

Assistant:

void WriteCall(Stream* stream,
               string_view name,
               const FuncType& func_type,
               const Values& params,
               const Values& results,
               const Trap::Ptr& trap) {
  stream->Writef(PRIstringview "(", WABT_PRINTF_STRING_VIEW_ARG(name));
  WriteValues(stream, func_type.params, params);
  stream->Writef(") =>");
  if (!trap) {
    if (!results.empty()) {
      stream->Writef(" ");
      WriteValues(stream, func_type.results, results);
    }
    stream->Writef("\n");
  } else {
    WriteTrap(stream, " error", trap);
  }
}